

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolutil.cpp
# Opt level: O3

UToolMemory * utm_open(char *name,int32_t initialCapacity,int32_t maxCapacity,int32_t size)

{
  UToolMemory *__dest;
  UToolMemory *extraout_RAX;
  UToolMemory *extraout_RAX_00;
  
  __dest = (UToolMemory *)uprv_malloc_63((long)(size * initialCapacity) + 0x60);
  if (__dest != (UToolMemory *)0x0) {
    if (maxCapacity <= initialCapacity) {
      maxCapacity = initialCapacity;
    }
    __dest->array = __dest->staticArray;
    strcpy((char *)__dest,name);
    __dest->capacity = initialCapacity;
    __dest->maxCapacity = maxCapacity;
    __dest->size = size;
    __dest->idx = 0;
    return __dest;
  }
  utm_open_cold_1();
  if (name != (char *)0x0) {
    if (*(char **)(name + 0x50) != name + 0x58) {
      uprv_free_63(*(char **)(name + 0x50));
    }
    uprv_free_63(name);
    return extraout_RAX_00;
  }
  return extraout_RAX;
}

Assistant:

U_CAPI UToolMemory * U_EXPORT2
utm_open(const char *name, int32_t initialCapacity, int32_t maxCapacity, int32_t size) {
    UToolMemory *mem;

    if(maxCapacity<initialCapacity) {
        maxCapacity=initialCapacity;
    }

    mem=(UToolMemory *)uprv_malloc(sizeof(UToolMemory)+initialCapacity*size);
    if(mem==NULL) {
        fprintf(stderr, "error: %s - out of memory\n", name);
        exit(U_MEMORY_ALLOCATION_ERROR);
    }
    mem->array=mem->staticArray;

    uprv_strcpy(mem->name, name);
    mem->capacity=initialCapacity;
    mem->maxCapacity=maxCapacity;
    mem->size=size;
    mem->idx=0;
    return mem;
}